

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O3

void __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  cmLinkLineComputer *this_00;
  bool bVar5;
  TargetType TVar6;
  int iVar7;
  ItemVector *pIVar8;
  cmLinkImplementation *pcVar9;
  string *psVar10;
  pointer this_01;
  pointer pcVar11;
  bool bVar12;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  basic_string_view<char,_std::char_traits<char>_> __str_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  string libPath;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_180;
  string local_150;
  char *local_130;
  size_type local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  undefined1 local_110 [32];
  element_type *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_d8;
  cmComputeLinkInformation *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string *local_b8;
  cmLinkLineComputer *local_b0;
  pointer local_a8;
  long *local_a0 [2];
  long local_90 [2];
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
             linkLibraries;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar8 = cmComputeLinkInformation::GetItems(cli);
  local_a0[0] = local_90;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  local_d0 = cli;
  local_b8 = stdLibString;
  local_b0 = &this->super_cmLinkLineComputer;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  this_01 = (pIVar8->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (pIVar8->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != local_a8) {
    bVar5 = false;
    do {
      if (bVar5) {
LAB_005cc39e:
        bVar5 = false;
      }
      else {
        if (this_01->Target != (cmGeneratorTarget *)0x0) {
          TVar6 = cmGeneratorTarget::GetType(this_01->Target);
          bVar5 = false;
          if (TVar6 - SHARED_LIBRARY < 3) goto LAB_005cc96f;
          if (TVar6 == STATIC_LIBRARY) {
            pcVar2 = this_01->Target;
            local_110._0_8_ = local_110 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_110,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
            bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_110);
            if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
              operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
            }
            if (bVar5) goto LAB_005cc39e;
          }
          else if (TVar6 == INTERFACE_LIBRARY) goto LAB_005cc96f;
        }
        local_128 = 0;
        local_120 = '\0';
        local_c8._M_allocated_capacity = 0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_130 = &local_120;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_c8);
        local_110._0_8_ = local_110 + 0x10;
        if (local_130 == &local_120) {
          local_110._24_8_ = uStack_118;
        }
        else {
          local_110._0_8_ = local_130;
        }
        local_110._17_7_ = uStack_11f;
        local_110[0x10] = local_120;
        local_110._8_8_ = local_128;
        local_128 = 0;
        local_120 = '\0';
        local_f0 = (element_type *)local_c8._M_allocated_capacity;
        aStack_e8._M_allocated_capacity = local_c8._8_8_;
        local_c8._M_allocated_capacity = 0;
        local_c8._8_8_ = 0;
        if (this_01->IsPath == Yes) {
          local_180.Value._M_string_length = (size_type)(this_01->Value).Value._M_dataplus._M_p;
          local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
          local_130 = &local_120;
          if ((local_180.Value._M_dataplus._M_p <
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2) ||
             (__str._M_str = ".o", __str._M_len = 2,
             iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,
                                (size_type)(local_180.Value._M_dataplus._M_p + -2),2,__str),
             iVar7 != 0)) {
            local_180.Value._M_string_length = (size_type)(this_01->Value).Value._M_dataplus._M_p;
            local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
            if ((local_180.Value._M_dataplus._M_p <
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x4) ||
               (__str_00._M_str = ".obj", __str_00._M_len = 4,
               iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,
                                  (size_type)(local_180.Value._M_dataplus._M_p + -4),4,__str_00),
               iVar7 != 0)) {
              local_180.Value._M_string_length = (size_type)(this_01->Value).Value._M_dataplus._M_p;
              local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
              if ((local_180.Value._M_dataplus._M_p <
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x2) ||
                 (__str_01._M_str = ".a", __str_01._M_len = 2,
                 iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,
                                    (size_type)(local_180.Value._M_dataplus._M_p + -2),2,__str_01),
                 iVar7 != 0)) {
                local_180.Value._M_string_length =
                     (size_type)(this_01->Value).Value._M_dataplus._M_p;
                local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
                if ((local_180.Value._M_dataplus._M_p <
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4) ||
                   (__str_02._M_str = ".lib", __str_02._M_len = 4,
                   iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_180
                                      ,(size_type)(local_180.Value._M_dataplus._M_p + -4),4,__str_02
                                     ), iVar7 != 0)) goto LAB_005cc771;
              }
            }
          }
          this_00 = local_b0;
          (*local_b0->_vptr_cmLinkLineComputer[2])(&local_80,local_b0,this_01);
          cmLinkLineComputer::ConvertToOutputFormat(&local_150,this_00,&local_80);
          cmComputeLinkInformation::Item::GetFormattedItem(&local_180,this_01,&local_150);
          std::__cxx11::string::operator=((string *)local_110,(string *)&local_180);
          if (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_180.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.Value._M_dataplus._M_p != &local_180.Value.field_2) {
            operator_delete(local_180.Value._M_dataplus._M_p,
                            local_180.Value.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
LAB_005cc771:
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&local_60,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::append((char *)local_110);
            pcVar2 = local_d0->Target;
            local_180.Value._M_dataplus._M_p = (pointer)&local_180.Value.field_2;
            pcVar1 = (local_d0->Config)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,pcVar1,pcVar1 + (local_d0->Config)._M_string_length);
            pcVar9 = cmGeneratorTarget::GetLinkImplementation(pcVar2,&local_180.Value,Link);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180.Value._M_dataplus._M_p != &local_180.Value.field_2) {
              operator_delete(local_180.Value._M_dataplus._M_p,
                              local_180.Value.field_2._M_allocated_capacity + 1);
            }
            pcVar3 = (pcVar9->super_cmLinkImplementationLibraries).Libraries.
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pcVar11 = (pcVar9->super_cmLinkImplementationLibraries).Libraries.
                           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                           _M_impl.super__Vector_impl_data._M_start; pcVar11 != pcVar3;
                pcVar11 = pcVar11 + 1) {
              while ((pcVar2 = (pcVar11->super_cmLinkItem).Target,
                     pcVar2 != (cmGeneratorTarget *)0x0 &&
                     (TVar6 = cmGeneratorTarget::GetType(pcVar2), TVar6 != INTERFACE_LIBRARY))) {
                pcVar2 = (pcVar11->super_cmLinkItem).Target;
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                pcVar1 = (local_d0->Config)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,pcVar1,pcVar1 + (local_d0->Config)._M_string_length)
                ;
                psVar10 = cmGeneratorTarget::GetLocation(pcVar2,&local_150);
                local_180.Value._M_dataplus._M_p = (pointer)&local_180.Value.field_2;
                pcVar1 = (psVar10->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_180,pcVar1,pcVar1 + psVar10->_M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                pcVar1 = (pointer)(this_01->Value).Value._M_string_length;
                if ((pcVar1 == (pointer)local_180.Value._M_string_length) &&
                   ((pcVar1 == (pointer)0x0 ||
                    (iVar7 = bcmp((this_01->Value).Value._M_dataplus._M_p,
                                  local_180.Value._M_dataplus._M_p,(size_t)pcVar1), iVar7 == 0)))) {
                  local_f0 = (pcVar11->super_cmLinkItem).Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &aStack_e8._M_allocated_capacity,
                             &(pcVar11->super_cmLinkItem).Backtrace.
                              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  bVar5 = true;
                }
                else {
                  bVar5 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.Value._M_dataplus._M_p != &local_180.Value.field_2) {
                  operator_delete(local_180.Value._M_dataplus._M_p,
                                  local_180.Value.field_2._M_allocated_capacity + 1);
                }
                pcVar11 = pcVar11 + 1;
                if (bVar5 || pcVar11 == pcVar3) goto LAB_005cc926;
              }
            }
LAB_005cc926:
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<BT<std::__cxx11::string>&>
                      (local_d8,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_110);
          }
          bVar5 = false;
        }
        else {
          local_180.Value._M_dataplus._M_p = (pointer)&local_180.Value.field_2;
          local_130 = &local_120;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"-framework","");
          _Var4._M_p = local_180.Value._M_dataplus._M_p;
          pcVar1 = (pointer)(this_01->Value).Value._M_string_length;
          if (pcVar1 == (pointer)local_180.Value._M_string_length) {
            if (pcVar1 == (pointer)0x0) {
              bVar12 = true;
            }
            else {
              iVar7 = bcmp((this_01->Value).Value._M_dataplus._M_p,local_180.Value._M_dataplus._M_p,
                           (size_t)pcVar1);
              bVar12 = iVar7 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p != &local_180.Value.field_2) {
            operator_delete(_Var4._M_p,local_180.Value.field_2._M_allocated_capacity + 1);
          }
          bVar5 = true;
          if (!bVar12) {
            local_180.Value._M_string_length = (size_type)(this_01->Value).Value._M_dataplus._M_p;
            local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
            __str_03._M_str = "-";
            __str_03._M_len = 1;
            iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,0,1,
                               __str_03);
            if (iVar7 == 0) {
              local_180.Value._M_string_length = (size_type)(this_01->Value).Value._M_dataplus._M_p;
              local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
              __str_04._M_str = "-l";
              __str_04._M_len = 2;
              iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,0,2,
                                 __str_04);
              if (iVar7 != 0) {
                local_180.Value._M_string_length =
                     (size_type)(this_01->Value).Value._M_dataplus._M_p;
                local_180.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
                __str_05._M_str = "-L";
                __str_05._M_len = 2;
                iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,0,
                                   2,__str_05);
                if (iVar7 != 0) {
                  local_180.Value._M_string_length =
                       (size_type)(this_01->Value).Value._M_dataplus._M_p;
                  local_180.Value._M_dataplus._M_p =
                       (pointer)(this_01->Value).Value._M_string_length;
                  __str_06._M_str = "--library";
                  __str_06._M_len = 9;
                  iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_180,
                                     0,9,__str_06);
                  if (iVar7 != 0) goto LAB_005cc771;
                }
              }
            }
            std::__cxx11::string::_M_assign((string *)local_110);
            goto LAB_005cc771;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_e8._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_e8._M_allocated_capacity
                    );
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
        }
      }
LAB_005cc96f:
      this_01 = this_01 + 1;
    } while (this_01 != local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_180.Value._M_string_length = (size_type)(local_b8->_M_dataplus)._M_p;
    local_180.Value.field_2._M_allocated_capacity = 0;
    local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(local_110 + 0x18);
    local_110._0_8_ = (char *)0x0;
    local_110._8_8_ = 1;
    local_110[0x18] = 0x20;
    local_180.Value.field_2._8_8_ = 1;
    local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    views._M_len = 2;
    views._M_array = (iterator)&local_180;
    local_180.Value._M_dataplus._M_p = (pointer)local_b8->_M_string_length;
    local_110._16_8_ =
         local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    cmCatViews(&local_150,views);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>(local_d8,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;

  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      // nvcc understands absolute paths to libraries ending in '.o', .a', or
      // '.lib'. These should be passed to nvlink.  Other extensions need to be
      // left out because nvlink may not understand or need them.  Even though
      // it can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value.Value, ".o") ||
          cmHasLiteralSuffix(item.Value.Value, ".obj") ||
          cmHasLiteralSuffix(item.Value.Value, ".a") ||
          cmHasLiteralSuffix(item.Value.Value, ".lib")) {
        linkLib.Value = item
                          .GetFormattedItem(this->ConvertToOutputFormat(
                            this->ConvertToLinkReference(item.Value.Value)))
                          .Value;
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value.Value)) {
      linkLib.Value = item.Value.Value;
    }

    if (emitted.insert(linkLib.Value).second) {
      linkLib.Value += " ";

      const cmLinkImplementation* linkImpl =
        cli.GetTarget()->GetLinkImplementation(
          cli.GetConfig(), cmGeneratorTarget::LinkInterfaceFor::Link);

      for (const cmLinkImplItem& iter : linkImpl->Libraries) {
        if (iter.Target != nullptr &&
            iter.Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
          std::string libPath = iter.Target->GetLocation(cli.GetConfig());
          if (item.Value == libPath) {
            linkLib.Backtrace = iter.Backtrace;
            break;
          }
        }
      }

      linkLibraries.emplace_back(linkLib);
    }
  }

  if (!stdLibString.empty()) {
    linkLibraries.emplace_back(cmStrCat(stdLibString, ' '));
  }
}